

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int spawn_tcp_server_helper(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int extraout_EDX;
  uv_process_options_t *unaff_RBX;
  uv_process_options_t *loop;
  uv__queue **ppuVar3;
  uv_handle_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t tcp;
  undefined1 *puStack_1c0;
  uv_loop_t *puStack_1b8;
  undefined8 uStack_1b0;
  uv__queue *puStack_1a0;
  uv__queue *puStack_198;
  uv_loop_t *puStack_190;
  uv__queue *puStack_180;
  uv__queue *puStack_178;
  uv_loop_t *puStack_170;
  uv_os_fd_t uStack_144;
  uv_stdio_container_t uStack_140;
  undefined4 uStack_130;
  undefined4 uStack_128;
  undefined4 uStack_120;
  undefined4 uStack_118;
  undefined4 uStack_110;
  uv_os_fd_t uStack_108;
  sockaddr_in sStack_100;
  uv_tcp_t local_d8;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&local_d8);
  if (iVar1 == 0) {
    iVar1 = uv_tcp_open(&local_d8,3);
    if (iVar1 != 0) goto LAB_001bcd33;
    iVar1 = uv_listen((uv_stream_t *)&local_d8,0x1000,(uv_connection_cb)0x0);
    if (iVar1 == 0) {
      return 1;
    }
  }
  else {
    spawn_tcp_server_helper_cold_1();
LAB_001bcd33:
    spawn_tcp_server_helper_cold_2();
  }
  spawn_tcp_server_helper_cold_3();
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_100);
  uStack_140._0_8_ = SEXT48(iVar1);
  if (uStack_140._0_8_ == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(puVar2,&tcp_server,2);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001bcf99;
    iVar1 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStack_100,0);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001bcfa8;
    iVar1 = uv_fileno((uv_handle_t *)&tcp_server,&uStack_144);
    uStack_140._0_8_ = SEXT48(iVar1);
    if (uStack_140._0_8_ != 0) goto LAB_001bcfb7;
    options.stdio = &uStack_140;
    unaff_RBX = &options;
    uStack_140._4_4_ = iVar1 >> 0x1f;
    uStack_140.flags = 2;
    uStack_140.data.file = 0;
    uStack_130 = 2;
    uStack_128 = 1;
    uStack_120 = 2;
    uStack_118 = 2;
    uStack_110 = 2;
    uStack_108 = uStack_144;
    options.stdio_count = 4;
    puVar2 = uv_default_loop();
    iVar1 = uv_spawn(puVar2,&process,&options);
    if (iVar1 != 0) goto LAB_001bcfc6;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_001bcfd5;
    if (exit_cb_called != 1) goto LAB_001bcfe4;
    if (close_cb_called != 1) goto LAB_001bcff3;
    unaff_RBX = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf99:
    run_test_spawn_tcp_server_cold_2();
LAB_001bcfa8:
    run_test_spawn_tcp_server_cold_3();
LAB_001bcfb7:
    run_test_spawn_tcp_server_cold_4();
LAB_001bcfc6:
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfd5:
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfe4:
    run_test_spawn_tcp_server_cold_7();
LAB_001bcff3:
    run_test_spawn_tcp_server_cold_8();
  }
  run_test_spawn_tcp_server_cold_9();
  puStack_190 = (uv_loop_t *)0x1bd02b;
  puStack_170 = (uv_loop_t *)unaff_RBX;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  loop = &options;
  options.stdio_count = 0;
  puStack_190 = (uv_loop_t *)0x1bd04b;
  puVar2 = uv_default_loop();
  puStack_190 = (uv_loop_t *)0x1bd05d;
  iVar1 = uv_spawn(puVar2,&process,&options);
  puStack_178 = (uv__queue *)(long)iVar1;
  puStack_180 = (uv__queue *)0x0;
  if (puStack_178 == (uv__queue *)0x0) {
    puStack_190 = (uv_loop_t *)0x1bd07e;
    puVar2 = uv_default_loop();
    puStack_190 = (uv_loop_t *)0x1bd088;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_178 = (uv__queue *)(long)iVar1;
    puStack_180 = (uv__queue *)0x0;
    if (puStack_178 != (uv__queue *)0x0) goto LAB_001bd15c;
    puStack_178 = (uv__queue *)0x1;
    puStack_180 = (uv__queue *)(long)exit_cb_called;
    if (puStack_180 != (uv__queue *)0x1) goto LAB_001bd16b;
    puStack_178 = (uv__queue *)0x1;
    puStack_180 = (uv__queue *)(long)close_cb_called;
    if (puStack_180 != (uv__queue *)0x1) goto LAB_001bd17a;
    puStack_190 = (uv_loop_t *)0x1bd0f7;
    loop = (uv_process_options_t *)uv_default_loop();
    puStack_190 = (uv_loop_t *)0x1bd10b;
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    puStack_190 = (uv_loop_t *)0x1bd115;
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_178 = (uv__queue *)0x0;
    puStack_190 = (uv_loop_t *)0x1bd123;
    puVar2 = uv_default_loop();
    puStack_190 = (uv_loop_t *)0x1bd12b;
    iVar1 = uv_loop_close(puVar2);
    puStack_180 = (uv__queue *)(long)iVar1;
    if (puStack_178 == puStack_180) {
      puStack_190 = (uv_loop_t *)0x1bd143;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_190 = (uv_loop_t *)0x1bd15c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd15c:
    puStack_190 = (uv_loop_t *)0x1bd16b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd16b:
    puStack_190 = (uv_loop_t *)0x1bd17a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd17a:
    puStack_190 = (uv_loop_t *)0x1bd189;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStack_190 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  ppuVar3 = &puStack_1a0;
  puStack_190 = (uv_loop_t *)loop;
  init_process_options("spawn_helper4",kill_cb);
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  puStack_198 = (uv__queue *)(long)iVar1;
  puStack_1a0 = (uv__queue *)0x0;
  if (puStack_198 == (uv__queue *)0x0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer);
    puStack_198 = (uv__queue *)(long)iVar1;
    puStack_1a0 = (uv__queue *)0x0;
    if (puStack_198 != (uv__queue *)0x0) goto LAB_001bd32a;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    puStack_198 = (uv__queue *)(long)iVar1;
    puStack_1a0 = (uv__queue *)0x0;
    if (puStack_198 != (uv__queue *)0x0) goto LAB_001bd337;
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_198 = (uv__queue *)(long)iVar1;
    puStack_1a0 = (uv__queue *)0x0;
    if (puStack_198 != (uv__queue *)0x0) goto LAB_001bd344;
    puStack_198 = (uv__queue *)0x1;
    puStack_1a0 = (uv__queue *)(long)exit_cb_called;
    if (puStack_1a0 != (uv__queue *)0x1) goto LAB_001bd351;
    puStack_198 = (uv__queue *)0x2;
    puStack_1a0 = (uv__queue *)(long)close_cb_called;
    if (puStack_1a0 != (uv__queue *)0x2) goto LAB_001bd35e;
    loop = (uv_process_options_t *)uv_default_loop();
    uv_walk((uv_loop_t *)loop,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)loop,UV_RUN_DEFAULT);
    puStack_198 = (uv__queue *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    puStack_1a0 = (uv__queue *)(long)iVar1;
    if (puStack_198 == puStack_1a0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
LAB_001bd32a:
    run_test_spawn_and_kill_cold_2();
LAB_001bd337:
    run_test_spawn_and_kill_cold_3();
LAB_001bd344:
    run_test_spawn_and_kill_cold_4();
LAB_001bd351:
    run_test_spawn_and_kill_cold_5();
LAB_001bd35e:
    run_test_spawn_and_kill_cold_6();
  }
  puVar4 = (uv_handle_t *)&puStack_198;
  run_test_spawn_and_kill_cold_7();
  uStack_1b0._0_4_ = UV_UNKNOWN_HANDLE;
  uStack_1b0._4_4_ = 0;
  puStack_1b8 = (uv_loop_t *)loop;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  puStack_1c0 = (undefined1 *)ppuVar3;
  if (ppuVar3 == (uv__queue **)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd419;
    uv_close(puVar4,close_cb);
    puStack_1c0 = (undefined1 *)(long)*(int *)&puVar4[1].loop;
    if (puStack_1c0 != (undefined1 *)0x0) {
      iVar1 = uv_kill(*(int *)&puVar4[1].loop,0);
      puStack_1c0 = (undefined1 *)(long)iVar1;
      if (puStack_1c0 == (undefined1 *)0xfffffffffffffffd) {
        return iVar1;
      }
      goto LAB_001bd42b;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd419:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd42b:
  puVar4 = (uv_handle_t *)&puStack_1c0;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar4,close_cb);
  return extraout_EAX;
}

Assistant:

int spawn_tcp_server_helper(void) {
  uv_tcp_t tcp;
  uv_os_sock_t handle;
  int r;

  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT_OK(r);

#ifdef _WIN32
  handle = _get_osfhandle(3);
#else
  handle = 3;
#endif
  r = uv_tcp_open(&tcp, handle);
  ASSERT_OK(r);

  /* Make sure that we can listen on a socket that was
   * passed down from the parent process
   */
  r = uv_listen((uv_stream_t*) &tcp, SOMAXCONN, NULL);
  ASSERT_OK(r);

  return 1;
}